

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O1

boolean jpeg_start_decompress(j_decompress_ptr cinfo)

{
  uint uVar1;
  JDIMENSION JVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_progress_mgr *pjVar4;
  int iVar5;
  
  if (cinfo->global_state == 0xca) {
    jinit_master_decompress(cinfo);
    iVar5 = 0xcf;
    if (cinfo->buffered_image != 0) goto LAB_0010a108;
    cinfo->global_state = 0xcb;
  }
  iVar5 = cinfo->global_state;
  if (iVar5 != 0xcc) {
    if (iVar5 == 0xcb) {
      if (cinfo->inputctl->has_multiple_scans != 0) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x31;
        (*pjVar3->error_exit)((j_common_ptr)cinfo);
      }
      cinfo->output_scan_number = cinfo->input_scan_number;
    }
    else {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x15;
      (pjVar3->msg_parm).i[0] = iVar5;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
  }
  if (cinfo->global_state != 0xcc) {
    (*cinfo->master->prepare_for_output_pass)(cinfo);
    cinfo->output_scanline = 0;
    cinfo->global_state = 0xcc;
  }
  if (cinfo->master->is_dummy_pass != 0) {
    do {
      while( true ) {
        uVar1 = cinfo->output_height;
        if (uVar1 <= cinfo->output_scanline) break;
        pjVar4 = cinfo->progress;
        if (pjVar4 != (jpeg_progress_mgr *)0x0) {
          pjVar4->pass_counter = (ulong)cinfo->output_scanline;
          pjVar4->pass_limit = (ulong)uVar1;
          (*pjVar4->progress_monitor)((j_common_ptr)cinfo);
        }
        JVar2 = cinfo->output_scanline;
        (*cinfo->main->process_data)(cinfo,(JSAMPARRAY)0x0,&cinfo->output_scanline,0);
        if (cinfo->output_scanline == JVar2) {
          return 0;
        }
      }
      (*cinfo->master->finish_output_pass)(cinfo);
      (*cinfo->master->prepare_for_output_pass)(cinfo);
      cinfo->output_scanline = 0;
    } while (cinfo->master->is_dummy_pass != 0);
  }
  iVar5 = 0xce - (uint)(cinfo->raw_data_out == 0);
LAB_0010a108:
  cinfo->global_state = iVar5;
  return 1;
}

Assistant:

GLOBAL(boolean)
jpeg_start_decompress (j_decompress_ptr cinfo)
{
  if (cinfo->global_state == DSTATE_READY) {
    /* First call: initialize master control, select active modules */
    jinit_master_decompress(cinfo);
    if (cinfo->buffered_image) {
      /* No more work here; expecting jpeg_start_output next */
      cinfo->global_state = DSTATE_BUFIMAGE;
      return TRUE;
    }
    cinfo->global_state = DSTATE_PRELOAD;
  }
  if (cinfo->global_state == DSTATE_PRELOAD) {
    /* If file has multiple scans, absorb them all into the coef buffer */
    if (cinfo->inputctl->has_multiple_scans) {
#ifdef D_MULTISCAN_FILES_SUPPORTED
      for (;;) {
	int retcode;
	/* Call progress monitor hook if present */
	if (cinfo->progress != NULL)
	  (*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
	/* Absorb some more input */
	retcode = (*cinfo->inputctl->consume_input) (cinfo);
	if (retcode == JPEG_SUSPENDED)
	  return FALSE;
	if (retcode == JPEG_REACHED_EOI)
	  break;
	/* Advance progress counter if appropriate */
	if (cinfo->progress != NULL &&
	    (retcode == JPEG_ROW_COMPLETED || retcode == JPEG_REACHED_SOS)) {
	  if (++cinfo->progress->pass_counter >= cinfo->progress->pass_limit) {
	    /* jdmaster underestimated number of scans; ratchet up one scan */
	    cinfo->progress->pass_limit += (long) cinfo->total_iMCU_rows;
	  }
	}
      }
#else
      ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif /* D_MULTISCAN_FILES_SUPPORTED */
    }
    cinfo->output_scan_number = cinfo->input_scan_number;
  } else if (cinfo->global_state != DSTATE_PRESCAN)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Perform any dummy output passes, and set up for the final pass */
  return output_pass_setup(cinfo);
}